

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O3

Vec_Ptr_t * Dar_BalanceCone(Aig_Obj_t *pObj,Vec_Vec_t *vStore,int Level)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  Vec_Ptr_t *vSuper;
  void **ppvVar4;
  void *pvVar5;
  int iVar6;
  Aig_Obj_t *pObj_00;
  long lVar7;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dar/darBalance.c"
                  ,0x7a,"Vec_Ptr_t *Dar_BalanceCone(Aig_Obj_t *, Vec_Vec_t *, int)");
  }
  if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dar/darBalance.c"
                  ,0x7b,"Vec_Ptr_t *Dar_BalanceCone(Aig_Obj_t *, Vec_Vec_t *, int)");
  }
  iVar6 = vStore->nSize;
  if (Level < iVar6) {
    if (Level < 0) goto LAB_0048d82a;
  }
  else {
    iVar1 = Level + 1;
    if (vStore->nCap <= Level) {
      if (vStore->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((long)iVar1 << 3);
      }
      else {
        ppvVar4 = (void **)realloc(vStore->pArray,(long)iVar1 << 3);
        iVar6 = vStore->nSize;
      }
      vStore->pArray = ppvVar4;
      vStore->nCap = iVar1;
    }
    if (iVar6 <= Level) {
      lVar7 = (long)iVar6;
      iVar6 = (Level - iVar6) + 1;
      do {
        pvVar5 = calloc(1,0x10);
        vStore->pArray[lVar7] = pvVar5;
        lVar7 = lVar7 + 1;
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
    }
    vStore->nSize = iVar1;
    if (0x7ffffffe < (uint)Level) goto LAB_0048d82a;
    puVar3 = (uint *)vStore->pArray[(uint)Level];
    uVar2 = puVar3[1];
    if (uVar2 == *puVar3) {
      if ((int)uVar2 < 0x10) {
        if (*(void **)(puVar3 + 2) == (void *)0x0) {
          pvVar5 = malloc(0x80);
        }
        else {
          pvVar5 = realloc(*(void **)(puVar3 + 2),0x80);
        }
        *(void **)(puVar3 + 2) = pvVar5;
        *puVar3 = 0x10;
      }
      else {
        if (*(void **)(puVar3 + 2) == (void *)0x0) {
          pvVar5 = malloc((ulong)uVar2 << 4);
        }
        else {
          pvVar5 = realloc(*(void **)(puVar3 + 2),(ulong)uVar2 << 4);
        }
        *(void **)(puVar3 + 2) = pvVar5;
        *puVar3 = uVar2 * 2;
      }
    }
    else {
      pvVar5 = *(void **)(puVar3 + 2);
    }
    uVar2 = puVar3[1];
    puVar3[1] = uVar2 + 1;
    *(undefined8 *)((long)pvVar5 + (long)(int)uVar2 * 8) = 0;
    iVar6 = vStore->nSize;
  }
  if (Level < iVar6) {
    vSuper = (Vec_Ptr_t *)vStore->pArray[(uint)Level];
    vSuper->nSize = 0;
    pObj_00 = pObj;
    Dar_BalanceCone_rec(pObj,pObj,vSuper);
    Dar_BalanceUniqify(pObj_00,vSuper,(uint)((*(uint *)&pObj->field_0x18 & 7) == 6));
    return vSuper;
  }
LAB_0048d82a:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecVec.h"
                ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
}

Assistant:

Vec_Ptr_t * Dar_BalanceCone( Aig_Obj_t * pObj, Vec_Vec_t * vStore, int Level )
{
    Vec_Ptr_t * vNodes;
    assert( !Aig_IsComplement(pObj) );
    assert( Aig_ObjIsNode(pObj) );
    // extend the storage
    if ( Vec_VecSize( vStore ) <= Level )
        Vec_VecPush( vStore, Level, 0 );
    // get the temporary array of nodes
    vNodes = Vec_VecEntry( vStore, Level );
    Vec_PtrClear( vNodes );
    // collect the nodes in the implication supergate
    Dar_BalanceCone_rec( pObj, pObj, vNodes );
    // remove duplicates
    Dar_BalanceUniqify( pObj, vNodes, Aig_ObjIsExor(pObj) );
    return vNodes;
}